

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

String * doctest::toString(String *__return_storage_ptr__,float in)

{
  char *in_00;
  long lVar1;
  size_t sVar2;
  string d;
  ostringstream oss;
  anon_union_24_2_13149d16_for_String_2 local_1e0;
  char *local_1c8;
  long local_1c0;
  char local_1b8 [16];
  undefined1 *local_1a8 [2];
  undefined1 local_198 [16];
  anon_union_24_2_13149d16_for_String_2 local_188;
  uint auStack_170 [22];
  ios_base local_118 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_188.data);
  *(undefined8 *)((long)auStack_170 + *(long *)(local_188.data.ptr + -0x18) + -0x10) = 5;
  *(uint *)((long)auStack_170 + *(long *)(local_188.data.ptr + -0x18)) =
       *(uint *)((long)auStack_170 + *(long *)(local_188.data.ptr + -0x18)) & 0xfffffefb | 4;
  std::ostream::_M_insert<double>((double)in);
  std::__cxx11::stringbuf::str();
  lVar1 = std::__cxx11::string::find_last_not_of((char)&local_1c8,0x30);
  if ((lVar1 != -1) && (lVar1 != local_1c0 + -1)) {
    std::__cxx11::string::substr((ulong)local_1a8,(ulong)&local_1c8);
    std::__cxx11::string::operator=((string *)&local_1c8,(string *)local_1a8);
    if (local_1a8[0] != local_198) {
      operator_delete(local_1a8[0]);
    }
  }
  in_00 = local_1c8;
  sVar2 = strlen(local_1c8);
  String::String((String *)&local_1e0.data,in_00,(uint)sVar2);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_188.data);
  std::ios_base::~ios_base(local_118);
  String::String((String *)&local_188.data,"f",1);
  String::operator+(__return_storage_ptr__,(String *)&local_1e0.data,(String *)&local_188.data);
  if ((local_188.buf[0x17] < '\0') && (local_188.data.ptr != (char *)0x0)) {
    operator_delete__(local_188.data.ptr);
  }
  if ((local_1e0.buf[0x17] < '\0') && (local_1e0.data.ptr != (char *)0x0)) {
    operator_delete__(local_1e0.data.ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

String toString(float in) { return fpToString(in, 5) + "f"; }